

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::accumulateDerivatives
          (BeagleCPUImpl<double,_1,_0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  if (outDerivatives == (double *)0x0) {
    accumulateDerivativesDispatch1<false>
              (this,(double *)0x0,outSumDerivatives,outSumSquaredDerivatives);
    return;
  }
  if (outSumDerivatives != (double *)0x0) {
    uVar1 = this->kPatternCount;
    if (outSumSquaredDerivatives == (double *)0x0) {
      if ((int)uVar1 < 1) {
        dVar6 = 0.0;
      }
      else {
        pdVar2 = this->grandNumeratorDerivTmp;
        pdVar3 = this->gPatternWeights;
        pdVar4 = this->grandDenominatorDerivTmp;
        auVar7 = ZEXT816(0);
        uVar5 = 0;
        do {
          auVar10._0_8_ = pdVar2[uVar5] / pdVar4[uVar5];
          auVar10._8_8_ = 0;
          outDerivatives[uVar5] = auVar10._0_8_;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pdVar3[uVar5];
          auVar7 = vfmadd231sd_fma(auVar7,auVar10,auVar9);
          dVar6 = auVar7._0_8_;
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      *outSumDerivatives = dVar6;
      return;
    }
    if ((int)uVar1 < 1) {
      dVar8 = 0.0;
      dVar6 = 0.0;
    }
    else {
      pdVar2 = this->grandNumeratorDerivTmp;
      pdVar3 = this->gPatternWeights;
      pdVar4 = this->grandDenominatorDerivTmp;
      auVar7 = ZEXT816(0);
      uVar5 = 0;
      auVar9 = ZEXT816(0);
      do {
        auVar11._0_8_ = pdVar2[uVar5] / pdVar4[uVar5];
        auVar11._8_8_ = 0;
        outDerivatives[uVar5] = auVar11._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = pdVar3[uVar5];
        auVar7 = vfmadd231sd_fma(auVar7,auVar11,auVar13);
        dVar6 = auVar7._0_8_;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auVar11._0_8_ * auVar11._0_8_;
        auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar12);
        dVar8 = auVar9._0_8_;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    *outSumDerivatives = dVar6;
    *outSumSquaredDerivatives = dVar8;
    return;
  }
  BeagleCPUImpl<double,1,0>::accumulateDerivativesDispatch2<true,false>
            ((BeagleCPUImpl<double,1,0> *)this,outDerivatives,(double *)0x0,outSumSquaredDerivatives
            );
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivatives(double* outDerivatives,
                                                              double* outSumDerivatives,
                                                              double* outSumSquaredDerivatives) {
    if (outDerivatives == NULL) {
        accumulateDerivativesDispatch1<false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch1<true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}